

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultExtendsClauseArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultExtendsClauseArgSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token defaultKeyword;
  Token openParen;
  DefaultExtendsClauseArgSyntax *pDVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pDVar1 = (DefaultExtendsClauseArgSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  openParen.info = (Info *)*in_RDX;
  openParen._0_8_ = (DefaultExtendsClauseArgSyntax *)in_RCX[1];
  defaultKeyword.info = (Info *)*in_RCX;
  defaultKeyword._0_8_ = pDVar1;
  slang::syntax::DefaultExtendsClauseArgSyntax::DefaultExtendsClauseArgSyntax
            ((DefaultExtendsClauseArgSyntax *)in_RCX[1],openParen,defaultKeyword,*in_RSI);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }